

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_buffer.h
# Opt level: O3

bool __thiscall
draco::RAnsBitDecoder::StartDecoding(RAnsBitDecoder *this,DecoderBuffer *source_buffer)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  uint8_t *puVar7;
  uint uVar8;
  uint32_t size_in_bytes;
  undefined8 uStack_18;
  
  uStack_18 = source_buffer->pos_;
  if (source_buffer->data_size_ < uStack_18 + 1) {
    return false;
  }
  this->prob_zero_ = source_buffer->data_[uStack_18];
  lVar4 = source_buffer->pos_;
  lVar1 = lVar4 + 1;
  source_buffer->pos_ = lVar1;
  if (source_buffer->bitstream_version_ < 0x202) {
    lVar6 = source_buffer->data_size_;
    lVar4 = lVar4 + 5;
    if (lVar6 < lVar4) {
      return false;
    }
    uStack_18._4_4_ = *(uint *)(source_buffer->data_ + lVar1);
    source_buffer->pos_ = lVar4;
  }
  else {
    bVar3 = anon_unknown_7::DecodeVarintUnsigned<unsigned_int>
                      (1,(uint *)((long)&uStack_18 + 4),source_buffer);
    if (!bVar3) {
      return false;
    }
    lVar6 = source_buffer->data_size_;
    lVar4 = source_buffer->pos_;
  }
  uVar5 = (ulong)uStack_18._4_4_;
  if (lVar6 - lVar4 < (long)uVar5) {
    return false;
  }
  if ((int)uStack_18._4_4_ < 1) {
    return false;
  }
  puVar7 = (uint8_t *)(source_buffer->data_ + lVar4);
  (this->ans_decoder_).buf = puVar7;
  uVar8 = uStack_18._4_4_ - 1;
  if (puVar7[uVar8] < 0x40) {
    (this->ans_decoder_).buf_offset = uVar8;
    uVar8 = puVar7[uVar8] & 0x3f;
  }
  else {
    bVar2 = puVar7[uVar8] >> 6;
    if (bVar2 == 2) {
      if (uStack_18._4_4_ < 3) {
        return false;
      }
      (this->ans_decoder_).buf_offset = uStack_18._4_4_ - 3;
      uVar8 = (*(ushort *)(puVar7 + (uVar5 - 2)) & 0x3fff) * 0x100;
      (this->ans_decoder_).state = puVar7[uVar5 - 3] + uVar8 + 0x1000;
      if (0xfefff < uVar8) {
        return false;
      }
      goto LAB_00152737;
    }
    if (bVar2 != 1) {
      return false;
    }
    if (uStack_18._4_4_ == 1) {
      return false;
    }
    (this->ans_decoder_).buf_offset = uStack_18._4_4_ - 2;
    uVar8 = (puVar7[uVar5 - 1] & 0x3f) << 8 | (uint)puVar7[uVar5 - 2];
  }
  (this->ans_decoder_).state = uVar8 + 0x1000;
LAB_00152737:
  source_buffer->pos_ = lVar4 + uVar5;
  return true;
}

Assistant:

bool Peek(T *out_val) {
    const size_t size_to_decode = sizeof(T);
    if (data_size_ < static_cast<int64_t>(pos_ + size_to_decode)) {
      return false;  // Buffer overflow.
    }
    memcpy(out_val, (data_ + pos_), size_to_decode);
    return true;
  }